

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O1

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  undefined1 *puVar1;
  byte bVar2;
  connectdata *conn;
  curl_trc_feat *pcVar3;
  curl_slist *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  char cVar7;
  int iVar8;
  CURLcode CVar9;
  int iVar10;
  CURLcode CVar11;
  char *pcVar12;
  size_t sVar13;
  time_t intime;
  size_t sVar14;
  char *pcVar15;
  char *pcVar16;
  curl_slist *pcVar17;
  long lVar18;
  byte *pbVar19;
  char *pcVar20;
  char *pcVar21;
  uchar *input;
  uchar *data_00;
  uchar *key;
  byte *pbVar22;
  byte *pbVar23;
  ulong uVar24;
  size_t sVar25;
  char *pcVar26;
  char *tmp;
  bool bVar27;
  bool bVar28;
  curl_slist *local_4a0;
  char *local_498;
  uchar *local_488;
  char *local_478;
  Curl_HttpReq httpreq;
  char timestamp [17];
  char *method;
  uchar sign0 [32];
  char service [65];
  uchar sign1 [32];
  char region [65];
  char provider0 [65];
  char provider1 [65];
  dynbuf canonical_query;
  dynbuf signed_headers;
  uchar sha_hash [32];
  dynbuf canonical_path;
  dynbuf canonical_headers;
  char sha_hex [65];
  char date [9];
  char content_sha256_hdr [151];
  char date_hdr_key [72];
  tm tm;
  
  conn = data->conn;
  provider0[0x40] = '\0';
  provider0[0x30] = '\0';
  provider0[0x31] = '\0';
  provider0[0x32] = '\0';
  provider0[0x33] = '\0';
  provider0[0x34] = '\0';
  provider0[0x35] = '\0';
  provider0[0x36] = '\0';
  provider0[0x37] = '\0';
  provider0[0x38] = '\0';
  provider0[0x39] = '\0';
  provider0[0x3a] = '\0';
  provider0[0x3b] = '\0';
  provider0[0x3c] = '\0';
  provider0[0x3d] = '\0';
  provider0[0x3e] = '\0';
  provider0[0x3f] = '\0';
  provider0[0x20] = '\0';
  provider0[0x21] = '\0';
  provider0[0x22] = '\0';
  provider0[0x23] = '\0';
  provider0[0x24] = '\0';
  provider0[0x25] = '\0';
  provider0[0x26] = '\0';
  provider0[0x27] = '\0';
  provider0[0x28] = '\0';
  provider0[0x29] = '\0';
  provider0[0x2a] = '\0';
  provider0[0x2b] = '\0';
  provider0[0x2c] = '\0';
  provider0[0x2d] = '\0';
  provider0[0x2e] = '\0';
  provider0[0x2f] = '\0';
  provider0[0x10] = '\0';
  provider0[0x11] = '\0';
  provider0[0x12] = '\0';
  provider0[0x13] = '\0';
  provider0[0x14] = '\0';
  provider0[0x15] = '\0';
  provider0[0x16] = '\0';
  provider0[0x17] = '\0';
  provider0[0x18] = '\0';
  provider0[0x19] = '\0';
  provider0[0x1a] = '\0';
  provider0[0x1b] = '\0';
  provider0[0x1c] = '\0';
  provider0[0x1d] = '\0';
  provider0[0x1e] = '\0';
  provider0[0x1f] = '\0';
  provider0[0] = '\0';
  provider0[1] = '\0';
  provider0[2] = '\0';
  provider0[3] = '\0';
  provider0[4] = '\0';
  provider0[5] = '\0';
  provider0[6] = '\0';
  provider0[7] = '\0';
  provider0[8] = '\0';
  provider0[9] = '\0';
  provider0[10] = '\0';
  provider0[0xb] = '\0';
  provider0[0xc] = '\0';
  provider0[0xd] = '\0';
  provider0[0xe] = '\0';
  provider0[0xf] = '\0';
  provider1[0x40] = '\0';
  provider1[0x30] = '\0';
  provider1[0x31] = '\0';
  provider1[0x32] = '\0';
  provider1[0x33] = '\0';
  provider1[0x34] = '\0';
  provider1[0x35] = '\0';
  provider1[0x36] = '\0';
  provider1[0x37] = '\0';
  provider1[0x38] = '\0';
  provider1[0x39] = '\0';
  provider1[0x3a] = '\0';
  provider1[0x3b] = '\0';
  provider1[0x3c] = '\0';
  provider1[0x3d] = '\0';
  provider1[0x3e] = '\0';
  provider1[0x3f] = '\0';
  provider1[0x20] = '\0';
  provider1[0x21] = '\0';
  provider1[0x22] = '\0';
  provider1[0x23] = '\0';
  provider1[0x24] = '\0';
  provider1[0x25] = '\0';
  provider1[0x26] = '\0';
  provider1[0x27] = '\0';
  provider1[0x28] = '\0';
  provider1[0x29] = '\0';
  provider1[0x2a] = '\0';
  provider1[0x2b] = '\0';
  provider1[0x2c] = '\0';
  provider1[0x2d] = '\0';
  provider1[0x2e] = '\0';
  provider1[0x2f] = '\0';
  provider1[0x10] = '\0';
  provider1[0x11] = '\0';
  provider1[0x12] = '\0';
  provider1[0x13] = '\0';
  provider1[0x14] = '\0';
  provider1[0x15] = '\0';
  provider1[0x16] = '\0';
  provider1[0x17] = '\0';
  provider1[0x18] = '\0';
  provider1[0x19] = '\0';
  provider1[0x1a] = '\0';
  provider1[0x1b] = '\0';
  provider1[0x1c] = '\0';
  provider1[0x1d] = '\0';
  provider1[0x1e] = '\0';
  provider1[0x1f] = '\0';
  provider1[0] = '\0';
  provider1[1] = '\0';
  provider1[2] = '\0';
  provider1[3] = '\0';
  provider1[4] = '\0';
  provider1[5] = '\0';
  provider1[6] = '\0';
  provider1[7] = '\0';
  provider1[8] = '\0';
  provider1[9] = '\0';
  provider1[10] = '\0';
  provider1[0xb] = '\0';
  provider1[0xc] = '\0';
  provider1[0xd] = '\0';
  provider1[0xe] = '\0';
  provider1[0xf] = '\0';
  region[0x40] = '\0';
  region[0x30] = '\0';
  region[0x31] = '\0';
  region[0x32] = '\0';
  region[0x33] = '\0';
  region[0x34] = '\0';
  region[0x35] = '\0';
  region[0x36] = '\0';
  region[0x37] = '\0';
  region[0x38] = '\0';
  region[0x39] = '\0';
  region[0x3a] = '\0';
  region[0x3b] = '\0';
  region[0x3c] = '\0';
  region[0x3d] = '\0';
  region[0x3e] = '\0';
  region[0x3f] = '\0';
  region[0x20] = '\0';
  region[0x21] = '\0';
  region[0x22] = '\0';
  region[0x23] = '\0';
  region[0x24] = '\0';
  region[0x25] = '\0';
  region[0x26] = '\0';
  region[0x27] = '\0';
  region[0x28] = '\0';
  region[0x29] = '\0';
  region[0x2a] = '\0';
  region[0x2b] = '\0';
  region[0x2c] = '\0';
  region[0x2d] = '\0';
  region[0x2e] = '\0';
  region[0x2f] = '\0';
  region[0x10] = '\0';
  region[0x11] = '\0';
  region[0x12] = '\0';
  region[0x13] = '\0';
  region[0x14] = '\0';
  region[0x15] = '\0';
  region[0x16] = '\0';
  region[0x17] = '\0';
  region[0x18] = '\0';
  region[0x19] = '\0';
  region[0x1a] = '\0';
  region[0x1b] = '\0';
  region[0x1c] = '\0';
  region[0x1d] = '\0';
  region[0x1e] = '\0';
  region[0x1f] = '\0';
  region[0] = '\0';
  region[1] = '\0';
  region[2] = '\0';
  region[3] = '\0';
  region[4] = '\0';
  region[5] = '\0';
  region[6] = '\0';
  region[7] = '\0';
  region[8] = '\0';
  region[9] = '\0';
  region[10] = '\0';
  region[0xb] = '\0';
  region[0xc] = '\0';
  region[0xd] = '\0';
  region[0xe] = '\0';
  region[0xf] = '\0';
  service[0x40] = '\0';
  service[0x30] = '\0';
  service[0x31] = '\0';
  service[0x32] = '\0';
  service[0x33] = '\0';
  service[0x34] = '\0';
  service[0x35] = '\0';
  service[0x36] = '\0';
  service[0x37] = '\0';
  service[0x38] = '\0';
  service[0x39] = '\0';
  service[0x3a] = '\0';
  service[0x3b] = '\0';
  service[0x3c] = '\0';
  service[0x3d] = '\0';
  service[0x3e] = '\0';
  service[0x3f] = '\0';
  service[0x20] = '\0';
  service[0x21] = '\0';
  service[0x22] = '\0';
  service[0x23] = '\0';
  service[0x24] = '\0';
  service[0x25] = '\0';
  service[0x26] = '\0';
  service[0x27] = '\0';
  service[0x28] = '\0';
  service[0x29] = '\0';
  service[0x2a] = '\0';
  service[0x2b] = '\0';
  service[0x2c] = '\0';
  service[0x2d] = '\0';
  service[0x2e] = '\0';
  service[0x2f] = '\0';
  service[0x10] = '\0';
  service[0x11] = '\0';
  service[0x12] = '\0';
  service[0x13] = '\0';
  service[0x14] = '\0';
  service[0x15] = '\0';
  service[0x16] = '\0';
  service[0x17] = '\0';
  service[0x18] = '\0';
  service[0x19] = '\0';
  service[0x1a] = '\0';
  service[0x1b] = '\0';
  service[0x1c] = '\0';
  service[0x1d] = '\0';
  service[0x1e] = '\0';
  service[0x1f] = '\0';
  service[0] = '\0';
  service[1] = '\0';
  service[2] = '\0';
  service[3] = '\0';
  service[4] = '\0';
  service[5] = '\0';
  service[6] = '\0';
  service[7] = '\0';
  service[8] = '\0';
  service[9] = '\0';
  service[10] = '\0';
  service[0xb] = '\0';
  service[0xc] = '\0';
  service[0xd] = '\0';
  service[0xe] = '\0';
  service[0xf] = '\0';
  pcVar16 = (conn->host).name;
  method = (char *)0x0;
  memset(content_sha256_hdr,0,0x97);
  pcVar26 = (data->state).aptr.user;
  if (pcVar26 == (char *)0x0) {
    pcVar26 = "";
  }
  sign0[0x10] = '\0';
  sign0[0x11] = '\0';
  sign0[0x12] = '\0';
  sign0[0x13] = '\0';
  sign0[0x14] = '\0';
  sign0[0x15] = '\0';
  sign0[0x16] = '\0';
  sign0[0x17] = '\0';
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  sign0[0] = '\0';
  sign0[1] = '\0';
  sign0[2] = '\0';
  sign0[3] = '\0';
  sign0[4] = '\0';
  sign0[5] = '\0';
  sign0[6] = '\0';
  sign0[7] = '\0';
  sign0[8] = '\0';
  sign0[9] = '\0';
  sign0[10] = '\0';
  sign0[0xb] = '\0';
  sign0[0xc] = '\0';
  sign0[0xd] = '\0';
  sign0[0xe] = '\0';
  sign0[0xf] = '\0';
  sign1[0x10] = '\0';
  sign1[0x11] = '\0';
  sign1[0x12] = '\0';
  sign1[0x13] = '\0';
  sign1[0x14] = '\0';
  sign1[0x15] = '\0';
  sign1[0x16] = '\0';
  sign1[0x17] = '\0';
  sign1[0x18] = '\0';
  sign1[0x19] = '\0';
  sign1[0x1a] = '\0';
  sign1[0x1b] = '\0';
  sign1[0x1c] = '\0';
  sign1[0x1d] = '\0';
  sign1[0x1e] = '\0';
  sign1[0x1f] = '\0';
  sign1[0] = '\0';
  sign1[1] = '\0';
  sign1[2] = '\0';
  sign1[3] = '\0';
  sign1[4] = '\0';
  sign1[5] = '\0';
  sign1[6] = '\0';
  sign1[7] = '\0';
  sign1[8] = '\0';
  sign1[9] = '\0';
  sign1[10] = '\0';
  sign1[0xb] = '\0';
  sign1[0xc] = '\0';
  sign1[0xd] = '\0';
  sign1[0xe] = '\0';
  sign1[0xf] = '\0';
  pcVar12 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar12 != (char *)0x0) {
    return CURLE_OK;
  }
  local_478 = "";
  Curl_dyn_init(&canonical_headers,0x19000);
  Curl_dyn_init(&canonical_query,0x19000);
  Curl_dyn_init(&signed_headers,0x19000);
  Curl_dyn_init(&canonical_path,0x19000);
  pcVar12 = (data->set).str[0x44];
  pcVar15 = "aws:amz";
  if (pcVar12 != (char *)0x0) {
    pcVar15 = pcVar12;
  }
  __isoc99_sscanf(pcVar15,"%64[^:]:%64[^:]:%64[^:]:%64s",provider0,provider1,region,service);
  if (provider0[0] == '\0') {
    Curl_failf(data,"first aws-sigv4 provider cannot be empty");
    CVar9 = CURLE_BAD_FUNCTION_ARGUMENT;
LAB_00139a70:
    local_498 = (char *)0x0;
    input = (uchar *)0x0;
    local_488 = (uchar *)0x0;
    pcVar16 = (char *)0x0;
LAB_00139a82:
    data_00 = (uchar *)0x0;
    key = (uchar *)0x0;
  }
  else {
    if (provider1[0] == '\0') {
      strcpy(provider1,provider0);
    }
    if (service[0] == '\0') {
      pcVar12 = strchr(pcVar16,0x2e);
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "aws-sigv4: service missing in parameters and hostname";
LAB_001396eb:
        bVar27 = false;
        Curl_failf(data,pcVar12);
        CVar9 = CURLE_URL_MALFORMAT;
      }
      else {
        uVar24 = (long)pcVar12 - (long)pcVar16;
        if (0x40 < uVar24) {
          pcVar12 = "aws-sigv4: service too long in hostname";
          goto LAB_001396eb;
        }
        memcpy(service,pcVar16,uVar24);
        service[uVar24] = '\0';
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"aws_sigv4: picked service %s from host",service);
        }
        CVar9 = CURLE_OUT_OF_MEMORY;
        bVar27 = true;
        if (region[0] == '\0') {
          pcVar12 = pcVar12 + 1;
          pcVar15 = strchr(pcVar12,0x2e);
          if (pcVar15 == (char *)0x0) {
            pcVar12 = "aws-sigv4: region missing in parameters and hostname";
          }
          else {
            uVar24 = (long)pcVar15 - (long)pcVar12;
            if (uVar24 < 0x41) {
              memcpy(region,pcVar12,uVar24);
              region[uVar24] = '\0';
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar3->log_level)))) {
                Curl_infof(data,"aws_sigv4: picked region %s from host",region);
              }
              goto LAB_0013976e;
            }
            pcVar12 = "aws-sigv4: region too long in hostname";
          }
          goto LAB_001396eb;
        }
      }
LAB_0013976e:
      if (bVar27) goto LAB_00139777;
      local_498 = (char *)0x0;
    }
    else {
LAB_00139777:
      Curl_http_method(data,conn,&method,&httpreq);
      iVar8 = curl_strequal(provider0,"aws");
      if (iVar8 == 0) {
        bVar27 = false;
      }
      else {
        iVar8 = curl_strequal(service,"s3");
        bVar27 = iVar8 != 0;
      }
      iVar8 = curl_msnprintf(date,0x52,"x-%s-content-sha256",provider1);
      pcVar12 = Curl_checkheaders(data,date,(long)iVar8);
      if (pcVar12 == (char *)0x0) {
        pcVar12 = (char *)0x0;
LAB_0013984b:
        sVar13 = 0;
      }
      else {
        pcVar12 = strchr(pcVar12,0x3a);
        if (pcVar12 == (char *)0x0) {
          sVar13 = 0;
          pcVar12 = (char *)0x0;
        }
        else {
          do {
            do {
              pcVar15 = pcVar12;
              pcVar12 = pcVar15 + 1;
            } while (*pcVar12 == ' ');
          } while (*pcVar12 == '\t');
          sVar13 = strlen(pcVar12);
          if (sVar13 != 0) {
            do {
              cVar7 = pcVar15[sVar13];
              if ((cVar7 != ' ') && (cVar7 != '\t')) goto LAB_00139854;
              sVar13 = sVar13 - 1;
            } while (sVar13 != 0);
            goto LAB_0013984b;
          }
        }
      }
LAB_00139854:
      if (pcVar12 == (char *)0x0) {
        if (bVar27) {
          bVar27 = true;
          if ((httpreq != HTTPREQ_GET) && (httpreq != HTTPREQ_HEAD)) {
            bVar27 = (data->set).filesize == 0;
          }
          if (httpreq == HTTPREQ_POST) {
            bVar28 = (data->set).postfields != (void *)0x0;
          }
          else {
            bVar28 = false;
          }
          if ((bool)(bVar27 | bVar28)) {
            CVar9 = calc_payload_hash(data,sha_hash,sha_hex);
            if (CVar9 != CURLE_OK) goto LAB_00139a63;
          }
          else {
            builtin_strncpy(sha_hex,"UNSIGNED-PAYLOAD",0x11);
          }
          CVar9 = CURLE_OK;
          curl_msnprintf(content_sha256_hdr,0x95,"x-%s-content-sha256: %s",provider1,sha_hex);
        }
        else {
          CVar9 = calc_payload_hash(data,sha_hash,sha_hex);
        }
LAB_00139a63:
        if (CVar9 != CURLE_OK) goto LAB_00139a70;
        pcVar12 = sha_hex;
        sVar13 = strlen(pcVar12);
      }
      intime = time((time_t *)0x0);
      CVar9 = Curl_gmtime(intime,&tm);
      if (CVar9 != CURLE_OK) {
        input = (uchar *)0x0;
        local_488 = (uchar *)0x0;
        pcVar16 = (char *)0x0;
        data_00 = (uchar *)0x0;
        key = (uchar *)0x0;
        local_498 = (char *)0x0;
        goto LAB_0013a06d;
      }
      sVar14 = strftime(timestamp,0x11,"%Y%m%dT%H%M%SZ",(tm *)&tm);
      CVar9 = CURLE_OUT_OF_MEMORY;
      if (sVar14 == 0) goto LAB_00139a70;
      sVar14 = strlen(provider1);
      Curl_strntolower(provider1,provider1,sVar14);
      cVar7 = Curl_raw_toupper(provider1[0]);
      provider1[0] = cVar7;
      local_4a0 = (curl_slist *)0x0;
      curl_msnprintf(date_hdr_key,0x48,"X-%s-Date",provider1);
      Curl_strntolower(provider1,provider1,1);
      curl_msnprintf(date,0x5a,"x-%s-date:%s",provider1,timestamp);
      pcVar15 = Curl_checkheaders(data,"Host",4);
      if (pcVar15 == (char *)0x0) {
        pcVar15 = (data->state).aptr.host;
        if (pcVar15 == (char *)0x0) {
          pcVar16 = curl_maprintf("host:%s",pcVar16);
        }
        else {
          sVar14 = strcspn(pcVar15,"\n\r");
          pcVar16 = (char *)Curl_memdup0(pcVar15,sVar14);
        }
        if (pcVar16 == (char *)0x0) {
          local_4a0 = (curl_slist *)0x0;
        }
        else {
          local_4a0 = Curl_slist_append_nodup((curl_slist *)0x0,pcVar16);
        }
        if (local_4a0 != (curl_slist *)0x0) goto LAB_00139b07;
        (*Curl_cfree)(pcVar16);
LAB_00139e08:
        CVar9 = CURLE_OUT_OF_MEMORY;
        local_498 = (char *)0x0;
      }
      else {
LAB_00139b07:
        pcVar17 = local_4a0;
        if ((content_sha256_hdr[0] != '\0') &&
           (pcVar17 = curl_slist_append(local_4a0,content_sha256_hdr), pcVar17 == (curl_slist *)0x0)
           ) goto LAB_00139e08;
        local_4a0 = pcVar17;
        for (pcVar4 = (data->set).headers; pcVar17 = local_4a0, pcVar4 != (curl_slist *)0x0;
            pcVar4 = pcVar4->next) {
          pcVar16 = pcVar4->data;
          pcVar15 = strchr(pcVar16,0x3a);
          if (pcVar15 == (char *)0x0) {
            pcVar15 = strchr(pcVar16,0x3b);
          }
          CVar9 = CURLE_COULDNT_RESOLVE_PROXY;
          if ((pcVar15 != (char *)0x0) && ((*pcVar15 != ':' || (pcVar15[1] != '\0')))) {
            lVar18 = 0;
            while (((cVar7 = pcVar15[lVar18 + 1], cVar7 == '\t' || (cVar7 == ' ')) ||
                   ((byte)(cVar7 - 10U) < 4))) {
              lVar18 = lVar18 + 1;
            }
            if ((lVar18 == 0) || (cVar7 != '\0')) {
              pcVar16 = (*Curl_cstrdup)(pcVar16);
              CVar9 = CURLE_FAILED_INIT;
              if (pcVar16 != (char *)0x0) {
                pcVar16[(long)pcVar15 - (long)pcVar4->data] = ':';
                pcVar17 = Curl_slist_append_nodup(local_4a0,pcVar16);
                if (pcVar17 == (curl_slist *)0x0) {
                  (*Curl_cfree)(pcVar16);
                }
                else {
                  CVar9 = CURLE_OK;
                  local_4a0 = pcVar17;
                }
              }
            }
          }
          if ((CVar9 != CURLE_OK) && (CVar9 != CURLE_COULDNT_RESOLVE_PROXY)) {
            if (CVar9 == CURLE_FAILED_INIT) {
              CVar9 = CURLE_OUT_OF_MEMORY;
              local_498 = (char *)0x0;
              goto LAB_0013a046;
            }
            local_498 = (char *)0x0;
            goto LAB_0013a04e;
          }
        }
        for (; pcVar17 != (curl_slist *)0x0; pcVar17 = pcVar17->next) {
          pcVar16 = pcVar17->data;
          sVar14 = strcspn(pcVar16,":");
          Curl_strntolower(pcVar16,pcVar16,sVar14);
          if (pcVar17->data[sVar14] != '\0') {
            pcVar16 = pcVar17->data + sVar14 + 1;
            for (pcVar15 = pcVar16; (cVar7 = *pcVar15, cVar7 == '\t' || (cVar7 == ' '));
                pcVar15 = pcVar15 + 1) {
            }
            while (cVar7 != '\0') {
              iVar8 = 0;
              for (; (cVar7 = *pcVar15, cVar7 == ' ' || (cVar7 == '\t')); pcVar15 = pcVar15 + 1) {
                iVar8 = iVar8 + -1;
              }
              if (iVar8 == 0) {
                pcVar15 = pcVar15 + 1;
LAB_00139ca6:
                *pcVar16 = cVar7;
                pcVar16 = pcVar16 + 1;
              }
              else {
                bVar27 = cVar7 != '\0';
                cVar7 = ' ';
                if (bVar27) goto LAB_00139ca6;
              }
              cVar7 = *pcVar15;
            }
            *pcVar16 = '\0';
          }
        }
        sVar14 = strlen(date_hdr_key);
        pcVar16 = Curl_checkheaders(data,date_hdr_key,sVar14);
        if (pcVar16 == (char *)0x0) {
          pcVar16 = Curl_checkheaders(data,"Date",4);
        }
        if (pcVar16 == (char *)0x0) {
          pcVar17 = curl_slist_append(local_4a0,date);
          if (pcVar17 == (curl_slist *)0x0) {
            CVar9 = CURLE_OUT_OF_MEMORY;
            local_498 = (char *)0x0;
          }
          else {
            local_498 = curl_maprintf("%s: %s\r\n",date_hdr_key,timestamp);
            local_4a0 = pcVar17;
LAB_00139ebb:
            if (local_4a0 == (curl_slist *)0x0) {
              CVar9 = CURLE_OK;
            }
            else {
              pcVar17 = local_4a0;
              bVar27 = false;
              do {
                bVar28 = bVar27;
                pcVar4 = pcVar17->next;
                if (pcVar4 != (curl_slist *)0x0) {
                  pcVar16 = pcVar17->data;
                  pcVar15 = pcVar4->data;
                  pcVar20 = strchr(pcVar16,0x3a);
                  pcVar21 = strchr(pcVar15,0x3a);
                  if (pcVar20 == (char *)0x0) {
                    sVar14 = strlen(pcVar16);
                  }
                  else {
                    sVar14 = (long)pcVar20 - (long)pcVar16;
                  }
                  if (pcVar21 == (char *)0x0) {
                    sVar25 = strlen(pcVar15);
                  }
                  else {
                    sVar25 = (long)pcVar21 - (long)pcVar15;
                  }
                  uVar24 = sVar25;
                  if (sVar14 < sVar25) {
                    uVar24 = sVar14;
                  }
                  iVar10 = strncmp(pcVar16,pcVar15,uVar24);
                  iVar8 = (int)sVar14 - (int)sVar25;
                  if (iVar10 != 0) {
                    iVar8 = iVar10;
                  }
                  if (0 < iVar8) {
                    pcVar17->data = pcVar15;
                    pcVar4->data = pcVar16;
                    bVar28 = true;
                  }
                }
                pcVar17 = pcVar4;
                bVar27 = bVar28;
              } while ((pcVar4 != (curl_slist *)0x0) ||
                      (pcVar17 = local_4a0, bVar27 = false, bVar28));
              CVar9 = CURLE_OUT_OF_MEMORY;
              do {
                CVar11 = Curl_dyn_add(&canonical_headers,pcVar17->data);
                if ((CVar11 != CURLE_OK) ||
                   (CVar11 = Curl_dyn_add(&canonical_headers,"\n"), CVar11 != CURLE_OK))
                goto LAB_0013a046;
                pcVar16 = strchr(pcVar17->data,0x3a);
                if (pcVar16 != (char *)0x0) {
                  *pcVar16 = '\0';
                }
                if (((pcVar17 != local_4a0) &&
                    (CVar11 = Curl_dyn_add(&signed_headers,";"), CVar11 != CURLE_OK)) ||
                   (CVar11 = Curl_dyn_add(&signed_headers,pcVar17->data), CVar11 != CURLE_OK))
                goto LAB_0013a046;
                pcVar17 = pcVar17->next;
              } while (pcVar17 != (curl_slist *)0x0);
              CVar9 = CURLE_OK;
            }
          }
        }
        else {
          pbVar19 = (byte *)strchr(pcVar16,0x3a);
          CVar9 = CURLE_OUT_OF_MEMORY;
          if (pbVar19 == (byte *)0x0) goto LAB_00139e08;
          pbVar23 = pbVar19 + 0x11;
          pbVar5 = pbVar19;
          while( true ) {
            pbVar22 = pbVar5 + 1;
            bVar2 = *pbVar22;
            if ((bVar2 != 9) && (pbVar6 = pbVar22, bVar2 != 0x20)) break;
            pbVar23 = pbVar23 + 1;
            pbVar5 = pbVar22;
          }
          while ((bVar2 != 0 &&
                 (((byte)(bVar2 - 0x30) < 10 || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a))))) {
            bVar2 = pbVar6[1];
            pbVar6 = pbVar6 + 1;
          }
          if (pbVar6 == pbVar23) {
            timestamp._0_8_ = *(undefined8 *)pbVar22;
            timestamp._8_8_ = *(undefined8 *)(pbVar5 + 9);
            timestamp[0x10] = '\0';
          }
          else {
            timestamp._0_8_ = timestamp._0_8_ & 0xffffffffffffff00;
          }
          local_498 = (char *)0x0;
          if (pbVar19 != (byte *)0x0) goto LAB_00139ebb;
        }
      }
LAB_0013a046:
      curl_slist_free_all(local_4a0);
LAB_0013a04e:
      if (CVar9 == CURLE_OK) {
        if (content_sha256_hdr[0] != '\0') {
          sVar14 = strlen(content_sha256_hdr);
          (content_sha256_hdr + sVar14)[0] = '\r';
          (content_sha256_hdr + sVar14)[1] = '\n';
          content_sha256_hdr[sVar14 + 2] = '\0';
        }
        date[0] = timestamp[0];
        date[1] = timestamp[1];
        date[2] = timestamp[2];
        date[3] = timestamp[3];
        date[4] = timestamp[4];
        date[5] = timestamp[5];
        date[6] = timestamp[6];
        date[7] = timestamp[7];
        date[8] = '\0';
        CVar9 = canon_query(data,(data->state).up.query,&canonical_query);
        if (CVar9 == CURLE_OK) {
          pcVar16 = (data->state).up.path;
          sVar14 = strlen(pcVar16);
          CVar9 = canon_string(pcVar16,sVar14,&canonical_path,(_Bool *)0x0);
          pcVar16 = method;
          if (CVar9 == CURLE_OK) {
            pcVar15 = Curl_dyn_ptr(&canonical_path);
            pcVar20 = Curl_dyn_ptr(&canonical_query);
            if (pcVar20 != (char *)0x0) {
              local_478 = Curl_dyn_ptr(&canonical_query);
            }
            pcVar20 = Curl_dyn_ptr(&canonical_headers);
            pcVar21 = Curl_dyn_ptr(&signed_headers);
            input = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%.*s",pcVar16,pcVar15,local_478,
                                           pcVar20,pcVar21,sVar13,pcVar12);
            if (input == (uchar *)0x0) {
              input = (uchar *)0x0;
            }
            else {
              sVar13 = strlen(provider0);
              Curl_strntolower(provider0,provider0,sVar13);
              local_488 = (uchar *)curl_maprintf("%s4_request",provider0);
              if (local_488 != (uchar *)0x0) {
                pcVar16 = curl_maprintf("%s/%s/%s/%s",date,region,service,local_488);
                if (pcVar16 == (char *)0x0) {
                  pcVar16 = (char *)0x0;
                  key = (uchar *)0x0;
                  CVar9 = CURLE_OUT_OF_MEMORY;
                  data_00 = (uchar *)0x0;
                  goto LAB_0013a06d;
                }
                sVar13 = strlen((char *)input);
                CVar9 = Curl_sha256it(sha_hash,input,sVar13);
                if (CVar9 != CURLE_OK) {
                  data_00 = (uchar *)0x0;
                  key = (uchar *)0x0;
                  CVar9 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0013a06d;
                }
                Curl_hexencode(sha_hash,0x20,(uchar *)sha_hex,0x41);
                sVar13 = strlen(provider0);
                Curl_strntoupper(provider0,provider0,sVar13);
                data_00 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",provider0,timestamp,
                                                 pcVar16,sha_hex);
                if (data_00 != (uchar *)0x0) {
                  pcVar12 = (data->state).aptr.passwd;
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = "";
                  }
                  key = (uchar *)curl_maprintf("%s4%s",provider0,pcVar12);
                  if (key == (uchar *)0x0) {
                    key = (uchar *)0x0;
                    CVar9 = CURLE_OUT_OF_MEMORY;
                  }
                  else {
                    sVar13 = strlen((char *)key);
                    sVar14 = strlen(date);
                    CVar9 = Curl_hmacit(Curl_HMAC_SHA256,key,sVar13,(uchar *)date,sVar14,sign0);
                    if (CVar9 == CURLE_OK) {
                      sVar13 = strlen(region);
                      CVar9 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,(uchar *)region,sVar13,sign1);
                      if (CVar9 == CURLE_OK) {
                        sVar13 = strlen(service);
                        CVar9 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,(uchar *)service,sVar13,
                                            sign0);
                        if (CVar9 == CURLE_OK) {
                          sVar13 = strlen((char *)local_488);
                          CVar9 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,local_488,sVar13,sign1);
                          if (CVar9 == CURLE_OK) {
                            sVar13 = strlen((char *)data_00);
                            CVar9 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,data_00,sVar13,sign0);
                            if (CVar9 == CURLE_OK) {
                              Curl_hexencode(sign0,0x20,(uchar *)sha_hex,0x41);
                              pcVar15 = Curl_dyn_ptr(&signed_headers);
                              pcVar12 = "";
                              if (local_498 != (char *)0x0) {
                                pcVar12 = local_498;
                              }
                              pcVar26 = curl_maprintf(
                                                  "Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s%s"
                                                  ,provider0,pcVar26,pcVar16,pcVar15,sha_hex,pcVar12
                                                  ,content_sha256_hdr);
                              if (pcVar26 != (char *)0x0) {
                                (*Curl_cfree)((data->state).aptr.userpwd);
                                (data->state).aptr.userpwd = pcVar26;
                                puVar1 = &(data->state).authhost.field_0x18;
                                *puVar1 = *puVar1 | 1;
                              }
                              CVar9 = CURLE_OK;
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0013a06d;
                }
                CVar9 = CURLE_OUT_OF_MEMORY;
                goto LAB_00139a82;
              }
            }
            local_488 = (uchar *)0x0;
            data_00 = (uchar *)0x0;
            key = (uchar *)0x0;
            pcVar16 = (char *)0x0;
            CVar9 = CURLE_OUT_OF_MEMORY;
            goto LAB_0013a06d;
          }
        }
        local_488 = (uchar *)0x0;
        data_00 = (uchar *)0x0;
        pcVar16 = (char *)0x0;
        input = (uchar *)0x0;
        key = (uchar *)0x0;
        goto LAB_0013a06d;
      }
    }
    input = (uchar *)0x0;
    local_488 = (uchar *)0x0;
    pcVar16 = (char *)0x0;
    data_00 = (uchar *)0x0;
    key = (uchar *)0x0;
  }
LAB_0013a06d:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_path);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  (*Curl_cfree)(input);
  (*Curl_cfree)(local_488);
  (*Curl_cfree)(pcVar16);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(key);
  (*Curl_cfree)(local_498);
  return CVar9;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode result = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  bool sign_as_s3 = FALSE;
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  struct dynbuf canonical_query;
  struct dynbuf canonical_path;
  char *date_header = NULL;
  Curl_HttpReq httpreq;
  const char *method = NULL;
  char *payload_hash = NULL;
  size_t payload_hash_len = 0;
  unsigned char sha_hash[CURL_SHA256_DIGEST_LENGTH];
  char sha_hex[SHA256_HEX_LENGTH];
  char content_sha256_hdr[CONTENT_SHA256_HDR_LEN + 2] = ""; /* add \r\n */
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[CURL_SHA256_DIGEST_LENGTH] = {0};
  unsigned char sign1[CURL_SHA256_DIGEST_LENGTH] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init those buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_query, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_path, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
  */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first aws-sigv4 provider cannot be empty");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "aws-sigv4: service missing in parameters and hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "aws-sigv4: service too long in hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    memcpy(service, hostname, len);
    service[len] = '\0';

    infof(data, "aws_sigv4: picked service %s from host", service);

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "aws-sigv4: region missing in parameters and hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "aws-sigv4: region too long in hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      memcpy(region, reg, len);
      region[len] = '\0';
      infof(data, "aws_sigv4: picked region %s from host", region);
    }
  }

  Curl_http_method(data, conn, &method, &httpreq);

  /* AWS S3 requires a x-amz-content-sha256 header, and supports special
   * values like UNSIGNED-PAYLOAD */
  sign_as_s3 = (strcasecompare(provider0, "aws") &&
                strcasecompare(service, "s3"));

  payload_hash = parse_content_sha_hdr(data, provider1, &payload_hash_len);

  if(!payload_hash) {
    if(sign_as_s3)
      result = calc_s3_payload_hash(data, httpreq, provider1, sha_hash,
                                    sha_hex, content_sha256_hdr);
    else
      result = calc_payload_hash(data, sha_hash, sha_hex);
    if(result)
      goto fail;

    payload_hash = sha_hex;
    /* may be shorter than SHA256_HEX_LENGTH, like S3_UNSIGNED_PAYLOAD */
    payload_hash_len = strlen(sha_hex);
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      clock = time(NULL);
  }
#else
  clock = time(NULL);
#endif
  result = Curl_gmtime(clock, &tm);
  if(result) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = make_headers(data, hostname, timestamp, provider1,
                        &date_header, content_sha256_hdr,
                        &canonical_headers, &signed_headers);
  if(result)
    goto fail;

  if(*content_sha256_hdr) {
    /* make_headers() needed this without the \r\n for canonicalization */
    size_t hdrlen = strlen(content_sha256_hdr);
    DEBUGASSERT(hdrlen + 3 < sizeof(content_sha256_hdr));
    memcpy(content_sha256_hdr + hdrlen, "\r\n", 3);
  }

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  result = canon_query(data, data->state.up.query, &canonical_query);
  if(result)
    goto fail;

  result = canon_string(data->state.up.path, strlen(data->state.up.path),
                        &canonical_path, NULL);
  if(result)
    goto fail;
  result = CURLE_OUT_OF_MEMORY;

  canonical_request =
    aprintf("%s\n" /* HTTPRequestMethod */
            "%s\n" /* CanonicalURI */
            "%s\n" /* CanonicalQueryString */
            "%s\n" /* CanonicalHeaders */
            "%s\n" /* SignedHeaders */
            "%.*s",  /* HashedRequestPayload in hex */
            method,
            Curl_dyn_ptr(&canonical_path),
            Curl_dyn_ptr(&canonical_query) ?
            Curl_dyn_ptr(&canonical_query) : "",
            Curl_dyn_ptr(&canonical_headers),
            Curl_dyn_ptr(&signed_headers),
            (int)payload_hash_len, payload_hash);
  if(!canonical_request)
    goto fail;

  DEBUGF(infof(data, "Canonical request: %s", canonical_request));

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = aprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = aprintf("%s/%s/%s/%s",
                             date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash);

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we only support HMAC.
   */
  str_to_sign = aprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                        "%s\n" /* RequestDateTime */
                        "%s\n" /* CredentialScope */
                        "%s",  /* HashedCanonicalRequest in hex */
                        provider0,
                        timestamp,
                        credential_scope,
                        sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = aprintf("%s4%s", provider0,
                   data->state.aptr.passwd ?
                   data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0);

  /* provider 0 uppercase */
  auth_headers = aprintf("Authorization: %s4-HMAC-SHA256 "
                         "Credential=%s/%s, "
                         "SignedHeaders=%s, "
                         "Signature=%s\r\n"
                         /*
                          * date_header is added here, only if it was not
                          * user-specified (using CURLOPT_HTTPHEADER).
                          * date_header includes \r\n
                          */
                         "%s"
                         "%s", /* optional sha256 header includes \r\n */
                         provider0,
                         user,
                         credential_scope,
                         Curl_dyn_ptr(&signed_headers),
                         sha_hex,
                         date_header ? date_header : "",
                         content_sha256_hdr);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  result = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_path);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return result;
}